

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::ConfidentialTransaction::GetByteData
          (ByteData *__return_storage_ptr__,ConfidentialTransaction *this,bool has_witness)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint flags;
  size_t tx;
  CfdException *pCVar5;
  char *pcVar6;
  uchar *puVar7;
  size_type sVar8;
  uint8_t *puVar9;
  uint64_t local_338;
  ulong local_2f0;
  ulong local_2e8;
  allocator local_281;
  string local_280;
  CfdSourceLocation local_260;
  undefined1 local_242;
  allocator local_241;
  string local_240;
  CfdSourceLocation local_220;
  CfdSourceLocation local_208;
  uchar *local_1f0;
  uchar *start_address;
  wally_tx_output *output_3;
  undefined8 *puStack_1d8;
  uint32_t i_7;
  wally_tx_witness_item *stack_3;
  undefined8 *puStack_1c8;
  uint32_t j_3;
  wally_tx_witness_item *stack_2;
  uint64_t uStack_1b8;
  uint32_t j_2;
  size_t num_items_1;
  wally_tx_input *input_3;
  long lStack_1a0;
  uint32_t i_6;
  wally_tx_output *output_2;
  undefined8 *puStack_190;
  uint32_t i_5;
  wally_tx_input *input_2;
  uint local_180;
  uint32_t i_4;
  uint32_t temp_index;
  uint8_t witness_flag;
  uint8_t *address_pointer;
  int local_168;
  char *local_160;
  long local_158;
  wally_tx_output *output_1;
  long lStack_148;
  uint32_t i_3;
  wally_tx_witness_item *stack_1;
  long lStack_138;
  uint32_t j_1;
  wally_tx_witness_item *stack;
  ulong uStack_128;
  uint32_t j;
  size_t num_items;
  wally_tx_input *input_1;
  long lStack_110;
  uint32_t i_2;
  wally_tx_output *output;
  long lStack_100;
  uint32_t i_1;
  wally_tx_input *input;
  ulong uStack_f0;
  uint32_t i;
  size_t need_size;
  undefined1 auStack_e0 [4];
  bool is_witness;
  bool has_txout_witness;
  bool has_txin_rangeproof;
  bool has_txin_witness;
  int local_d8;
  char *local_d0;
  size_type local_c8;
  size_t txsize;
  undefined1 local_b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  allocator local_71;
  string local_70;
  CfdSourceLocation local_50;
  int local_38;
  uint local_34;
  int ret;
  uint32_t flag;
  size_t size;
  wally_tx *tx_pointer;
  ConfidentialTransaction *pCStack_18;
  bool has_witness_local;
  ConfidentialTransaction *this_local;
  
  size = (size_t)(this->super_AbstractTransaction).wally_tx_pointer_;
  _ret = 0;
  local_34 = (uint)has_witness;
  tx_pointer._7_1_ = has_witness;
  pCStack_18 = this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  local_38 = wally_tx_get_length((wally_tx *)size,local_34,(size_t *)&ret);
  if (local_38 != 0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0xe7b;
    local_50.funcname = "GetByteData";
    logger::warn<int&,bool&>
              (&local_50,"wally_tx_get_length NG[{}]. wit[{}]",&local_38,
               (bool *)((long)&tx_pointer + 7));
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_70,"tx length calc error.",&local_71);
    CfdException::CfdException(pCVar5,kCfdIllegalStateError,&local_70);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_38 = 0;
  if (_ret < 0xb) {
    local_38 = -2;
    pcVar6 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(pcVar6 + 1);
    logger::warn<unsigned_long&>
              ((CfdSourceLocation *)
               &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"tx size low.[{}]",(unsigned_long *)&ret);
  }
  sVar8 = _ret;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&txsize + 7));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,sVar8,
             (allocator<unsigned_char> *)((long)&txsize + 7));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&txsize + 7));
  tx = size;
  flags = local_34;
  if (local_38 != -2) {
    local_c8 = _ret;
    puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
    sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
    local_38 = wally_tx_to_bytes((wally_tx *)tx,flags,puVar7,sVar8,&local_c8);
  }
  if (local_38 == -2) {
    if ((*(long *)(size + 0x10) != 0) && (*(long *)(size + 0x28) != 0)) {
      local_220.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_220.filename = local_220.filename + 1;
      local_220.line = 0xf67;
      local_220.funcname = "GetByteData";
      logger::warn<int&,unsigned_long&,unsigned_long&>
                (&local_220,"wally_tx_to_bytes NG[{}]. in/out={}/{}",&local_38,
                 (unsigned_long *)(size + 0x10),(unsigned_long *)(size + 0x28));
      local_242 = 1;
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_240,"tx hex convert error.",&local_241);
      CfdException::CfdException(pCVar5,kCfdIllegalStateError,&local_240);
      local_242 = 0;
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    _auStack_e0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                          ,0x2f);
    _auStack_e0 = _auStack_e0 + 1;
    local_d8 = 0xe92;
    local_d0 = "GetByteData";
    logger::info<unsigned_long&>
              ((CfdSourceLocation *)auStack_e0,"wally_tx_get_length size[{}]",(unsigned_long *)&ret)
    ;
    need_size._7_1_ = 0;
    need_size._6_1_ = 0;
    need_size._5_1_ = 0;
    need_size._4_1_ = 0;
    uStack_f0 = *(long *)(size + 0x28) * 0x70 + *(long *)(size + 0x10) * 0xd0 + 0x38;
    for (input._4_4_ = 0; (ulong)input._4_4_ < *(ulong *)(size + 0x10);
        input._4_4_ = input._4_4_ + 1) {
      lStack_100 = *(long *)(size + 8) + (ulong)input._4_4_ * 0xd0;
      uStack_f0 = uStack_f0 + 0x40;
      if (*(long *)(lStack_100 + 0x88) != 0) {
        uStack_f0 = *(long *)(lStack_100 + 0x90) + 10 + uStack_f0;
      }
      if (*(long *)(lStack_100 + 0x98) != 0) {
        uStack_f0 = *(long *)(lStack_100 + 0xa0) + 10 + uStack_f0;
      }
    }
    for (output._4_4_ = 0; (ulong)output._4_4_ < *(ulong *)(size + 0x28);
        output._4_4_ = output._4_4_ + 1) {
      lStack_110 = *(long *)(size + 0x20) + (ulong)output._4_4_ * 0x70;
      if (*(long *)(lStack_110 + 0x20) != 0) {
        uStack_f0 = *(long *)(lStack_110 + 0x28) + 10 + uStack_f0;
      }
      if (*(long *)(lStack_110 + 0x30) != 0) {
        uStack_f0 = *(long *)(lStack_110 + 0x38) + 10 + uStack_f0;
      }
      if (*(long *)(lStack_110 + 0x40) != 0) {
        uStack_f0 = *(long *)(lStack_110 + 0x48) + 10 + uStack_f0;
      }
      if (*(long *)(lStack_110 + 8) != 0) {
        uStack_f0 = *(long *)(lStack_110 + 0x10) + 10 + uStack_f0;
      }
      uStack_f0 = uStack_f0 + 10;
    }
    for (input_1._4_4_ = 0; (ulong)input_1._4_4_ < *(ulong *)(size + 0x10);
        input_1._4_4_ = input_1._4_4_ + 1) {
      num_items = *(long *)(size + 8) + (ulong)input_1._4_4_ * 0xd0;
      if (*(long *)(num_items + 0xa8) != 0) {
        uStack_f0 = *(long *)(num_items + 0xb0) + 10 + uStack_f0;
        need_size._6_1_ = 1;
      }
      if (*(long *)(num_items + 0xb8) != 0) {
        uStack_f0 = *(long *)(num_items + 0xc0) + 10 + uStack_f0;
        need_size._6_1_ = 1;
      }
      if (*(long *)(num_items + 0x38) == 0) {
        local_2e8 = 0;
      }
      else {
        local_2e8 = *(ulong *)(*(long *)(num_items + 0x38) + 8);
      }
      for (stack._4_4_ = 0; stack._4_4_ < local_2e8; stack._4_4_ = stack._4_4_ + 1) {
        lStack_138 = **(long **)(num_items + 0x38) + (ulong)stack._4_4_ * 0x10;
        uStack_f0 = *(long *)(lStack_138 + 8) + 10 + uStack_f0;
        need_size._7_1_ = 1;
      }
      if (*(long *)(num_items + 200) == 0) {
        local_2f0 = 0;
      }
      else {
        local_2f0 = *(ulong *)(*(long *)(num_items + 200) + 8);
      }
      uStack_128 = local_2f0;
      for (stack_1._4_4_ = 0; stack_1._4_4_ < local_2f0; stack_1._4_4_ = stack_1._4_4_ + 1) {
        lStack_148 = **(long **)(num_items + 200) + (ulong)stack_1._4_4_ * 0x10;
        uStack_f0 = *(long *)(lStack_148 + 8) + 10 + uStack_f0;
        need_size._7_1_ = 1;
      }
      uStack_f0 = uStack_f0 + 10;
    }
    for (output_1._4_4_ = 0; uVar4 = uStack_f0, (ulong)output_1._4_4_ < *(ulong *)(size + 0x28);
        output_1._4_4_ = output_1._4_4_ + 1) {
      local_158 = *(long *)(size + 0x20) + (ulong)output_1._4_4_ * 0x70;
      if (*(long *)(local_158 + 0x50) != 0) {
        uStack_f0 = *(long *)(local_158 + 0x58) + 10 + uStack_f0;
        need_size._5_1_ = 1;
      }
      if (*(long *)(local_158 + 0x60) != 0) {
        uStack_f0 = *(long *)(local_158 + 0x68) + 10 + uStack_f0;
        need_size._5_1_ = 1;
      }
      uStack_f0 = uStack_f0 + 10;
    }
    sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
    if (sVar8 < uVar4) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,uStack_f0);
      pcVar6 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                       ,0x2f);
      address_pointer = (uint8_t *)(pcVar6 + 1);
      local_168 = 0xedb;
      local_160 = "GetByteData";
      logger::info<unsigned_long&>
                ((CfdSourceLocation *)&address_pointer,"buffer.resize[{}]",&stack0xffffffffffffff10)
      ;
    }
    puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
    *(undefined4 *)puVar7 = *(undefined4 *)size;
    i_4._3_1_ = '\0';
    if (((*(uint *)size & 0x40000000) == 0) &&
       ((((need_size._7_1_ & 1) != 0 || ((need_size._6_1_ & 1) != 0)) ||
        ((need_size._5_1_ & 1) != 0)))) {
      need_size._4_1_ = 1;
      i_4._3_1_ = '\x01';
    }
    puVar7[4] = i_4._3_1_;
    _temp_index = puVar7 + 5;
    _temp_index = AbstractTransaction::CopyVariableInt(*(uint64_t *)(size + 0x10),_temp_index);
    for (input_2._4_4_ = 0; (ulong)input_2._4_4_ < *(ulong *)(size + 0x10);
        input_2._4_4_ = input_2._4_4_ + 1) {
      puStack_190 = (undefined8 *)(*(long *)(size + 8) + (ulong)input_2._4_4_ * 0xd0);
      local_180 = *(uint *)(puStack_190 + 4);
      if ((puStack_190[0x19] != 0) && (*(long *)(puStack_190[0x19] + 8) != 0)) {
        local_180 = local_180 | 0x40000000;
      }
      if ((puStack_190[0x11] != 0) && (puStack_190[0x12] != 0)) {
        local_180 = local_180 | 0x80000000;
      }
      uVar1 = *puStack_190;
      uVar2 = puStack_190[1];
      uVar3 = puStack_190[3];
      *(undefined8 *)(_temp_index + 0x10) = puStack_190[2];
      *(undefined8 *)(_temp_index + 0x18) = uVar3;
      *(undefined8 *)_temp_index = uVar1;
      *(undefined8 *)(_temp_index + 8) = uVar2;
      *(uint *)(_temp_index + 0x20) = local_180;
      _temp_index = _temp_index + 0x24;
      puVar9 = AbstractTransaction::CopyVariableBuffer
                         ((uint8_t *)puStack_190[5],puStack_190[6],_temp_index);
      *(undefined4 *)puVar9 = *(undefined4 *)((long)puStack_190 + 0x24);
      _temp_index = puVar9 + 4;
      if ((need_size._6_1_ & 1) != 0) {
        *(undefined8 *)_temp_index = *(undefined8 *)((long)puStack_190 + 0x41);
        *(undefined8 *)(puVar9 + 0xc) = *(undefined8 *)((long)puStack_190 + 0x49);
        *(undefined8 *)(puVar9 + 0x14) = *(undefined8 *)((long)puStack_190 + 0x51);
        *(undefined8 *)(puVar9 + 0x1c) = *(undefined8 *)((long)puStack_190 + 0x59);
        *(undefined8 *)(puVar9 + 0x24) = *(undefined8 *)((long)puStack_190 + 0x61);
        *(undefined8 *)(puVar9 + 0x2c) = *(undefined8 *)((long)puStack_190 + 0x69);
        *(undefined8 *)(puVar9 + 0x34) = *(undefined8 *)((long)puStack_190 + 0x71);
        *(undefined8 *)(puVar9 + 0x3c) = *(undefined8 *)((long)puStack_190 + 0x79);
        _temp_index = puVar9 + 0x44;
        _temp_index = CopyConfidentialCommitment
                                ((void *)puStack_190[0x11],puStack_190[0x12],9,_temp_index);
        _temp_index = CopyConfidentialCommitment
                                ((void *)puStack_190[0x13],puStack_190[0x14],9,_temp_index);
      }
    }
    _temp_index = AbstractTransaction::CopyVariableInt(*(uint64_t *)(size + 0x28),_temp_index);
    for (output_2._4_4_ = 0; (ulong)output_2._4_4_ < *(ulong *)(size + 0x28);
        output_2._4_4_ = output_2._4_4_ + 1) {
      lStack_1a0 = *(long *)(size + 0x20) + (ulong)output_2._4_4_ * 0x70;
      _temp_index = CopyConfidentialCommitment
                              (*(void **)(lStack_1a0 + 0x20),*(size_t *)(lStack_1a0 + 0x28),0x21,
                               _temp_index);
      _temp_index = CopyConfidentialCommitment
                              (*(void **)(lStack_1a0 + 0x30),*(size_t *)(lStack_1a0 + 0x38),9,
                               _temp_index);
      _temp_index = CopyConfidentialCommitment
                              (*(void **)(lStack_1a0 + 0x40),*(size_t *)(lStack_1a0 + 0x48),0x21,
                               _temp_index);
      _temp_index = AbstractTransaction::CopyVariableBuffer
                              (*(uint8_t **)(lStack_1a0 + 8),*(size_t *)(lStack_1a0 + 0x10),
                               _temp_index);
    }
    *(undefined4 *)_temp_index = *(undefined4 *)(size + 4);
    _temp_index = _temp_index + 4;
    if ((need_size._4_1_ & 1) != 0) {
      for (input_3._4_4_ = 0; (ulong)input_3._4_4_ < *(ulong *)(size + 0x10);
          input_3._4_4_ = input_3._4_4_ + 1) {
        num_items_1 = *(long *)(size + 8) + (ulong)input_3._4_4_ * 0xd0;
        _temp_index = AbstractTransaction::CopyVariableBuffer
                                (*(uint8_t **)(num_items_1 + 0xa8),*(size_t *)(num_items_1 + 0xb0),
                                 _temp_index);
        _temp_index = AbstractTransaction::CopyVariableBuffer
                                (*(uint8_t **)(num_items_1 + 0xb8),*(size_t *)(num_items_1 + 0xc0),
                                 _temp_index);
        if (*(long *)(num_items_1 + 0x38) == 0) {
          local_338 = 0;
        }
        else {
          local_338 = *(uint64_t *)(*(long *)(num_items_1 + 0x38) + 8);
        }
        uStack_1b8 = local_338;
        _temp_index = AbstractTransaction::CopyVariableInt(local_338,_temp_index);
        for (stack_2._4_4_ = 0; stack_2._4_4_ < uStack_1b8; stack_2._4_4_ = stack_2._4_4_ + 1) {
          puStack_1c8 = (undefined8 *)
                        (**(long **)(num_items_1 + 0x38) + (ulong)stack_2._4_4_ * 0x10);
          _temp_index = AbstractTransaction::CopyVariableBuffer
                                  ((uint8_t *)*puStack_1c8,puStack_1c8[1],_temp_index);
        }
        uStack_1b8 = 0;
        if (*(long *)(num_items_1 + 200) != 0) {
          uStack_1b8 = *(uint64_t *)(*(long *)(num_items_1 + 200) + 8);
        }
        _temp_index = AbstractTransaction::CopyVariableInt(uStack_1b8,_temp_index);
        for (stack_3._4_4_ = 0; stack_3._4_4_ < uStack_1b8; stack_3._4_4_ = stack_3._4_4_ + 1) {
          puStack_1d8 = (undefined8 *)(**(long **)(num_items_1 + 200) + (ulong)stack_3._4_4_ * 0x10)
          ;
          _temp_index = AbstractTransaction::CopyVariableBuffer
                                  ((uint8_t *)*puStack_1d8,puStack_1d8[1],_temp_index);
        }
      }
      for (output_3._4_4_ = 0; (ulong)output_3._4_4_ < *(ulong *)(size + 0x28);
          output_3._4_4_ = output_3._4_4_ + 1) {
        start_address = (uchar *)(*(long *)(size + 0x20) + (ulong)output_3._4_4_ * 0x70);
        _temp_index = AbstractTransaction::CopyVariableBuffer
                                (*(uint8_t **)(start_address + 0x50),
                                 *(size_t *)(start_address + 0x58),_temp_index);
        _temp_index = AbstractTransaction::CopyVariableBuffer
                                (*(uint8_t **)(start_address + 0x60),
                                 *(size_t *)(start_address + 0x68),_temp_index);
      }
    }
    local_1f0 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
    _ret = (long)_temp_index - (long)local_1f0;
    sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
    if (_ret < sVar8) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,_ret);
      local_208.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_208.filename = local_208.filename + 1;
      local_208.line = 0xf63;
      local_208.funcname = "GetByteData";
      logger::info<unsigned_long&>(&local_208,"set buffer size[{}]",(unsigned_long *)&ret);
    }
  }
  else if (local_38 != 0) {
    local_260.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_260.filename = local_260.filename + 1;
    local_260.line = 0xf6c;
    local_260.funcname = "GetByteData";
    logger::warn<int&>(&local_260,"wally_tx_to_bytes NG[{}].",&local_38);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_280,"tx hex convert error.",&local_281);
    CfdException::CfdException(pCVar5,kCfdIllegalStateError,&local_280);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransaction::GetByteData(bool has_witness) const {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  size_t size = 0;
  uint32_t flag = 0;
  if (has_witness) {
    flag = WALLY_TX_FLAG_USE_WITNESS;
  }

  int ret = wally_tx_get_length(tx_pointer, flag, &size);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_get_length NG[{}]. wit[{}]", ret,
        has_witness);
    throw CfdException(kCfdIllegalStateError, "tx length calc error.");
  }
  // info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
  if (size < kElementsTransactionMinimumSize) {
    ret = WALLY_EINVAL;
    warn(CFD_LOG_SOURCE, "tx size low.[{}]", size);
  }
  std::vector<uint8_t> buffer(size);
  if (ret != WALLY_EINVAL) {
    size_t txsize = size;
    // flag |= WALLY_TX_FLAG_USE_ELEMENTS;
    ret = wally_tx_to_bytes(
        tx_pointer, flag, buffer.data(), buffer.size(), &txsize);
  }
  if (ret == WALLY_EINVAL) {
    /* About conversion with object.
     * In libwally, txin / txout does not allow empty data.
     * Therefore, if txin / txout is empty, object to byte is an error.
     * Therefore, it performs its own processing under certain circumstances.
     */
    if ((tx_pointer->num_inputs == 0) || (tx_pointer->num_outputs == 0)) {
      info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
      bool has_txin_witness = false;
      bool has_txin_rangeproof = false;
      bool has_txout_witness = false;
      bool is_witness = false;
      // Necessary size calculation because wally_tx_get_length may be
      // an invalid value (reserved more)
      size_t need_size = sizeof(struct wally_tx);
      need_size += tx_pointer->num_inputs * sizeof(struct wally_tx_input);
      need_size += tx_pointer->num_outputs * sizeof(struct wally_tx_output);
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        need_size += sizeof(input->blinding_nonce);
        need_size += sizeof(input->entropy);
        if (input->issuance_amount) {
          need_size += input->issuance_amount_len + 10;
        }
        if (input->inflation_keys) {
          need_size += input->inflation_keys_len + 10;
        }
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->asset) need_size += output->asset_len + 10;
        if (output->value) need_size += output->value_len + 10;
        if (output->nonce) need_size += output->nonce_len + 10;
        if (output->script) need_size += output->script_len + 10;
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        // issuance amount range proof
        if (input->issuance_amount_rangeproof) {
          need_size += input->issuance_amount_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // inflation keys range proof
        if (input->inflation_keys_rangeproof) {
          need_size += input->inflation_keys_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // witness
        size_t num_items = input->witness ? input->witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        // pegin_witness
        num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->pegin_witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->surjectionproof) {
          need_size += output->surjectionproof_len + 10;
          has_txout_witness = true;
        }
        if (output->rangeproof) {
          need_size += output->rangeproof_len + 10;
          has_txout_witness = true;
        }
        need_size += 10;
      }
      if (need_size > buffer.size()) {
        buffer.resize(need_size);
        info(CFD_LOG_SOURCE, "buffer.resize[{}]", need_size);
      }

      uint8_t *address_pointer = buffer.data();
      memcpy(
          address_pointer, &tx_pointer->version, sizeof(tx_pointer->version));
      address_pointer += sizeof(tx_pointer->version);
      uint8_t witness_flag = 0;
      if ((tx_pointer->version & kTransactionVersionNoWitness) == 0) {
        if (has_txin_witness || has_txin_rangeproof || has_txout_witness) {
          is_witness = true;
          witness_flag = 1;
        }
      }
      *address_pointer = witness_flag;
      ++address_pointer;

      // txin
      address_pointer =
          CopyVariableInt(tx_pointer->num_inputs, address_pointer);
      uint32_t temp_index;
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        temp_index = input->index;
        if (input->pegin_witness && (input->pegin_witness->num_items > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_PEGIN_FLAG);
        }
        if (input->issuance_amount && (input->issuance_amount_len > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_ISSUANCE_FLAG);
        }
        memcpy(address_pointer, input->txhash, sizeof(input->txhash));
        address_pointer += sizeof(input->txhash);
        memcpy(address_pointer, &temp_index, sizeof(temp_index));
        address_pointer += sizeof(temp_index);
        address_pointer = CopyVariableBuffer(
            input->script, input->script_len, address_pointer);
        memcpy(address_pointer, &input->sequence, sizeof(input->sequence));
        address_pointer += sizeof(input->sequence);
        if (has_txin_rangeproof) {
          // blinding_nonce
          memcpy(
              address_pointer, &input->blinding_nonce,
              sizeof(input->blinding_nonce));
          address_pointer += sizeof(input->blinding_nonce);
          // entropy
          memcpy(address_pointer, &input->entropy, sizeof(input->entropy));
          address_pointer += sizeof(input->entropy);
          // issuance amount
          address_pointer = CopyConfidentialCommitment(
              input->issuance_amount, input->issuance_amount_len,
              kConfidentialValueSize, address_pointer);
          // inflation keys
          address_pointer = CopyConfidentialCommitment(
              input->inflation_keys, input->inflation_keys_len,
              kConfidentialValueSize, address_pointer);
        }
      }

      // txout
      address_pointer =
          CopyVariableInt(tx_pointer->num_outputs, address_pointer);
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        // asset (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->asset, output->asset_len, kConfidentialDataSize,
            address_pointer);
        // value (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->value, output->value_len, kConfidentialValueSize,
            address_pointer);
        // nonce (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->nonce, output->nonce_len, kConfidentialDataSize,
            address_pointer);
        // script
        address_pointer = CopyVariableBuffer(
            output->script, output->script_len, address_pointer);
      }

      // locktime
      memcpy(
          address_pointer, &tx_pointer->locktime,
          sizeof(tx_pointer->locktime));
      address_pointer += sizeof(tx_pointer->locktime);

      // witness
      if (is_witness) {
        for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
          const struct wally_tx_input *input = tx_pointer->inputs + i;
          // issuance amount range proof
          address_pointer = CopyVariableBuffer(
              input->issuance_amount_rangeproof,
              input->issuance_amount_rangeproof_len, address_pointer);
          // inflation keys range proof
          address_pointer = CopyVariableBuffer(
              input->inflation_keys_rangeproof,
              input->inflation_keys_rangeproof_len, address_pointer);
          // witness
          size_t num_items = input->witness ? input->witness->num_items : 0;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
          // pegin_witness
          num_items = 0;
          if (input->pegin_witness)
            num_items = input->pegin_witness->num_items;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->pegin_witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
        }

        for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
          const struct wally_tx_output *output = tx_pointer->outputs + i;
          // surjection proof
          address_pointer = CopyVariableBuffer(
              output->surjectionproof, output->surjectionproof_len,
              address_pointer);
          // range proof
          address_pointer = CopyVariableBuffer(
              output->rangeproof, output->rangeproof_len, address_pointer);
        }
      }

      unsigned char *start_address = buffer.data();
      size = address_pointer - start_address;
      if (buffer.size() > size) {
        buffer.resize(size);
        info(CFD_LOG_SOURCE, "set buffer size[{}]", size);
      }
    } else {
      warn(
          CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}]. in/out={}/{}", ret,
          tx_pointer->num_inputs, tx_pointer->num_outputs);
      throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
    }
  } else if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
  }

  return ByteData(buffer);
}